

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O1

HighsDebugStatus debugCompareHighsInfoDouble(string *name,HighsOptions *options,double v0,double v1)

{
  HighsLogType type;
  HighsDebugStatus HVar1;
  double dVar2;
  string value_adjective;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  
  HVar1 = kOk;
  if ((v0 != v1) || (NAN(v0) || NAN(v1))) {
    dVar2 = highsRelativeDifference(v0,v1);
    local_40 = 0;
    local_38[0] = 0;
    local_48 = local_38;
    if (dVar2 <= excessive_relative_solution_param_error) {
      if (dVar2 <= 1e-12) {
        type = kVerbose;
        HVar1 = kOk;
        std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,0x3ddd3b);
      }
      else {
        HVar1 = kWarning;
        std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,0x3d3bc7);
        type = kDetailed;
      }
    }
    else {
      std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,0x3d3bbd);
      type = kError;
      HVar1 = kError;
    }
    highsLogDev(&(options->super_HighsOptionsStruct).log_options,type,
                "SolutionPar:  %-9s relative difference of %9.4g for %s\n",dVar2,local_48,
                (name->_M_dataplus)._M_p);
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
  }
  return HVar1;
}

Assistant:

HighsDebugStatus debugCompareHighsInfoDouble(const string name,
                                             const HighsOptions& options,
                                             const double v0, const double v1) {
  if (v0 == v1) return HighsDebugStatus::kOk;
  double delta = highsRelativeDifference(v0, v1);
  std::string value_adjective;
  HighsLogType report_level;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  if (delta > excessive_relative_solution_param_error) {
    value_adjective = "Excessive";
    report_level = HighsLogType::kError;
    return_status = HighsDebugStatus::kError;
  } else if (delta > large_relative_solution_param_error) {
    value_adjective = "Large";
    report_level = HighsLogType::kDetailed;
    return_status = HighsDebugStatus::kWarning;
  } else {
    value_adjective = "OK";
    report_level = HighsLogType::kVerbose;
  }
  highsLogDev(options.log_options, report_level,
              "SolutionPar:  %-9s relative difference of %9.4g for %s\n",
              value_adjective.c_str(), delta, name.c_str());
  return return_status;
}